

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
::
find<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry,unsigned_int&>
          (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::Entry>
                 table,uint *params)

{
  uint uVar1;
  ArrayDisposer *pAVar2;
  size_t sVar3;
  uint *puVar4;
  uint *in_R8;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ArrayDisposer *pAVar8;
  Maybe<unsigned_long> MVar9;
  Maybe<unsigned_long> MVar10;
  
  MVar9.ptr.field_1.value = table.size_;
  pAVar2 = ((table.ptr)->value).paramExports.disposer;
  if (pAVar2 == (ArrayDisposer *)0x0) {
    *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
             )0x0;
    MVar9.ptr._0_8_ = this;
    return (Maybe<unsigned_long>)MVar9.ptr;
  }
  uVar1 = *in_R8;
  uVar5 = uVar1 * 0x8000 + ~uVar1;
  uVar5 = (uVar5 >> 0xc ^ uVar5) * 5;
  uVar6 = (uVar5 >> 4 ^ uVar5) * 0x809;
  uVar6 = uVar6 >> 0x10 ^ uVar6;
  uVar7 = (ulong)((int)pAVar2 - 1U & uVar6);
  sVar3 = ((table.ptr)->value).paramExports.size_;
  uVar5 = *(uint *)(sVar3 + 4 + uVar7 * 8);
  if (uVar5 != 0) {
    puVar4 = (uint *)(sVar3 + uVar7 * 8);
    do {
      if (((uVar5 != 1) && (*puVar4 == uVar6)) &&
         (*(uint *)(MVar9.ptr.field_1.value + (ulong)(uVar5 - 2) * 0x30) == uVar1)) {
        *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(uVar5 - 2);
        goto LAB_00322bf9;
      }
      pAVar8 = (ArrayDisposer *)(uVar7 + 1);
      uVar7 = (ulong)pAVar8 & 0xffffffff;
      if (pAVar8 == pAVar2) {
        uVar7 = 0;
      }
      puVar4 = (uint *)(sVar3 + uVar7 * 8);
      uVar5 = puVar4[1];
    } while (uVar5 != 0);
  }
  *this = (HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::Callbacks>
           )0x0;
LAB_00322bf9:
  MVar10.ptr.field_1.value = MVar9.ptr.field_1.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return kj::none;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return kj::none;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }